

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

ssize_t sftp_readdir(LIBSSH2_SFTP_HANDLE *handle,char *buffer,size_t buffer_maxlen,char *longentry,
                    size_t longentry_maxlen,LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  _libssh2_sftp_handle_data *p_Var1;
  LIBSSH2_SFTP *sftp;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  ssize_t sVar5;
  char *pcVar6;
  uchar *puVar7;
  LIBSSH2_SFTP_ATTRIBUTES *pLVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *data;
  size_t data_len;
  LIBSSH2_SFTP_ATTRIBUTES attrs_dummy;
  size_t in_stack_ffffffffffffff58;
  char *local_90;
  LIBSSH2_SFTP_ATTRIBUTES *local_88;
  size_t local_80;
  char *local_78;
  uchar *local_70;
  LIBSSH2_SFTP_ATTRIBUTES local_68;
  
  sftp = handle->sftp;
  channel = sftp->channel;
  session = channel->session;
  local_70 = (uchar *)0x0;
  iVar2 = (int)handle->handle_len;
  uVar9 = (ulong)(iVar2 + 0xd);
  local_80 = longentry_maxlen;
  local_78 = buffer;
  if (sftp->readdir_state == libssh2_NB_state_idle) {
    sftp->last_errno = 0;
    local_88 = attrs;
    if ((handle->u).dir.names_left != 0) {
      uVar9 = (handle->u).dir.names_packet_len;
      if (uVar9 < 4) {
        return -0x26;
      }
      puVar7 = (uchar *)(handle->u).dir.next_name;
      uVar3 = _libssh2_ntohu32(puVar7);
      pcVar6 = local_78;
      uVar4 = (ulong)uVar3;
      uVar9 = uVar9 - 4;
      uVar10 = uVar9 - uVar4;
      if (uVar9 < uVar4 || buffer_maxlen <= uVar4) {
        return -0x26;
      }
      puVar7 = puVar7 + 4;
      memcpy(local_78,puVar7,uVar4);
      pcVar6[uVar4] = '\0';
      if (uVar10 < 4) {
        return -0x26;
      }
      uVar3 = _libssh2_ntohu32(puVar7 + uVar4);
      uVar9 = (ulong)uVar3;
      puVar7 = puVar7 + uVar4 + 4;
      uVar10 = uVar10 - 4;
      if (1 < local_80 && longentry != (char *)0x0) {
        if (local_80 <= uVar9) {
          return -0x26;
        }
        if (uVar10 < uVar9) {
          return -0x26;
        }
        memcpy(longentry,puVar7,uVar9);
        longentry[uVar9] = '\0';
      }
      if (uVar10 < uVar9) {
        return -0x26;
      }
      if (local_88 == (LIBSSH2_SFTP_ATTRIBUTES *)0x0) {
        pLVar8 = &local_68;
      }
      else {
        local_88->permissions = 0;
        local_88->atime = 0;
        local_88->uid = 0;
        local_88->gid = 0;
        local_88->flags = 0;
        local_88->filesize = 0;
        local_88->mtime = 0;
        pLVar8 = local_88;
      }
      sVar5 = sftp_bin2attr(pLVar8,puVar7 + uVar9,uVar10 - uVar9);
      if (-1 < sVar5) {
        (handle->u).dir.next_name = (char *)(puVar7 + uVar9 + sVar5);
        (handle->u).file.data = (uchar *)((uVar10 - uVar9) - sVar5);
        p_Var1 = &handle->u;
        (p_Var1->dir).names_left = (p_Var1->dir).names_left - 1;
        if ((p_Var1->dir).names_left == 0) {
          (*session->free)((handle->u).dir.names_packet,&session->abstract);
          return uVar4;
        }
        return uVar4;
      }
      return -0x26;
    }
    local_68.flags = (unsigned_long)(*session->alloc)(uVar9,&session->abstract);
    sftp->readdir_packet = (uchar *)local_68.flags;
    if ((uchar *)local_68.flags == (uchar *)0x0) {
      pcVar6 = "Unable to allocate memory for FXP_READDIR packet";
      iVar2 = -6;
      local_68.flags = 0;
      goto LAB_00123beb;
    }
    _libssh2_store_u32((uchar **)&local_68,iVar2 + 9);
    *(uchar *)local_68.flags = '\f';
    uVar3 = sftp->request_id;
    sftp->request_id = uVar3 + 1;
    sftp->readdir_request_id = uVar3;
    local_68.flags = (unsigned_long)(local_68.flags + 1);
    _libssh2_store_u32((uchar **)&local_68,uVar3);
    _libssh2_store_str((uchar **)&local_68,handle->handle,handle->handle_len);
    sftp->readdir_state = libssh2_NB_state_created;
    pLVar8 = local_88;
LAB_00123856:
    local_88 = pLVar8;
    uVar4 = _libssh2_channel_write(channel,0,sftp->readdir_packet,uVar9);
    if (uVar4 == 0xffffffffffffffdb) {
      return -0x25;
    }
    (*session->free)(sftp->readdir_packet,&session->abstract);
    sftp->readdir_packet = (uchar *)0x0;
    if (uVar4 != uVar9) {
      sftp->readdir_state = libssh2_NB_state_idle;
      pcVar6 = "_libssh2_channel_write() failed";
      iVar2 = -7;
      goto LAB_00123beb;
    }
    sftp->readdir_state = libssh2_NB_state_sent;
    attrs = local_88;
  }
  else {
    pLVar8 = attrs;
    if (sftp->readdir_state == libssh2_NB_state_created) goto LAB_00123856;
  }
  iVar2 = sftp_packet_requirev
                    (sftp,0x1319ec,(uchar *)(ulong)sftp->readdir_request_id,(uint32_t)&local_90,
                     &local_70,(size_t *)0x9,in_stack_ffffffffffffff58);
  if (iVar2 == 0) {
    if (*local_90 != 'e') {
      sftp->readdir_state = libssh2_NB_state_idle;
      uVar3 = _libssh2_ntohu32((uchar *)(local_90 + 5));
      if (uVar3 == 0) {
        (*session->free)(local_90,&session->abstract);
        return 0;
      }
      (handle->u).dir.names_left = uVar3;
      (handle->u).dir.names_packet = local_90;
      (handle->u).dir.next_name = local_90 + 9;
      (handle->u).file.data = local_70 + -9;
      sVar5 = sftp_readdir(handle,local_78,buffer_maxlen,longentry,local_80,attrs);
      return sVar5;
    }
    uVar3 = _libssh2_ntohu32((uchar *)(local_90 + 5));
    (*session->free)(local_90,&session->abstract);
    if (uVar3 == 1) {
      sftp->readdir_state = libssh2_NB_state_idle;
      return 0;
    }
    sftp->last_errno = uVar3;
    sftp->readdir_state = libssh2_NB_state_idle;
    pcVar6 = "SFTP Protocol Error";
  }
  else {
    if (iVar2 == -0x25) {
      return -0x25;
    }
    if (iVar2 != -0x26) {
      sftp->readdir_state = libssh2_NB_state_idle;
      pcVar6 = "Timeout waiting for status message";
      goto LAB_00123beb;
    }
    if (local_70 != (uchar *)0x0) {
      (*session->free)(local_90,&session->abstract);
    }
    pcVar6 = "Status message too short";
  }
  iVar2 = -0x1f;
LAB_00123beb:
  iVar2 = _libssh2_error(session,iVar2,pcVar6);
  return (long)iVar2;
}

Assistant:

static ssize_t sftp_readdir(LIBSSH2_SFTP_HANDLE *handle, char *buffer,
                            size_t buffer_maxlen, char *longentry,
                            size_t longentry_maxlen,
                            LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    uint32_t num_names;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + handle_len(4) */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 13);
    unsigned char *s, *data;
    static const unsigned char read_responses[2] = {
        SSH_FXP_NAME, SSH_FXP_STATUS };
    ssize_t retcode;

    if(sftp->readdir_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        if(handle->u.dir.names_left) {
            /*
             * A prior request returned more than one directory entry,
             * feed it back from the buffer
             */
            LIBSSH2_SFTP_ATTRIBUTES attrs_dummy;
            size_t real_longentry_len;
            size_t real_filename_len;
            size_t filename_len;
            size_t longentry_len;
            size_t names_packet_len = handle->u.dir.names_packet_len;
            ssize_t attr_len = 0;

            if(names_packet_len >= 4) {
                s = (unsigned char *) handle->u.dir.next_name;
                real_filename_len = _libssh2_ntohu32(s);
                s += 4;
                names_packet_len -= 4;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            filename_len = real_filename_len;
            if(filename_len >= buffer_maxlen) {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            if(buffer_maxlen >= filename_len && names_packet_len >=
               filename_len) {
                memcpy(buffer, s, filename_len);
                buffer[filename_len] = '\0';           /* zero terminate */
                s += real_filename_len;
                names_packet_len -= real_filename_len;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            if(names_packet_len >= 4) {
                real_longentry_len = _libssh2_ntohu32(s);
                s += 4;
                names_packet_len -= 4;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            if(longentry && (longentry_maxlen > 1)) {
                longentry_len = real_longentry_len;

                if(longentry_len >= longentry_maxlen ||
                   longentry_len > names_packet_len) {
                    filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                    goto end;
                }

                memcpy(longentry, s, longentry_len);
                longentry[longentry_len] = '\0'; /* zero terminate */
            }

            if(real_longentry_len <= names_packet_len) {
                s += real_longentry_len;
                names_packet_len -= real_longentry_len;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            if(attrs)
                memset(attrs, 0, sizeof(LIBSSH2_SFTP_ATTRIBUTES));

            attr_len = sftp_bin2attr(attrs ? attrs : &attrs_dummy, s,
                                     names_packet_len);

            if(attr_len >= 0) {
                s += attr_len;
                names_packet_len -= attr_len;
            }
            else {
                filename_len = (size_t)LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                goto end;
            }

            handle->u.dir.next_name = (char *) s;
            handle->u.dir.names_packet_len = names_packet_len;

            if((--handle->u.dir.names_left) == 0)
                LIBSSH2_FREE(session, handle->u.dir.names_packet);

end:
            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "libssh2_sftp_readdir_ex() return %d",
                           filename_len));
            return (ssize_t)filename_len;
        }

        /* Request another entry(entries?) */

        s = sftp->readdir_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!sftp->readdir_packet)
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "FXP_READDIR packet");

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = SSH_FXP_READDIR;
        sftp->readdir_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->readdir_request_id);
        _libssh2_store_str(&s, handle->handle, handle->handle_len);

        sftp->readdir_state = libssh2_NB_state_created;
    }

    if(sftp->readdir_state == libssh2_NB_state_created) {
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Reading entries from directory handle"));
        retcode = _libssh2_channel_write(channel, 0, sftp->readdir_packet,
                                         packet_len);
        if(retcode == LIBSSH2_ERROR_EAGAIN) {
            return retcode;
        }
        else if((ssize_t)packet_len != retcode) {
            LIBSSH2_FREE(session, sftp->readdir_packet);
            sftp->readdir_packet = NULL;
            sftp->readdir_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "_libssh2_channel_write() failed");
        }

        LIBSSH2_FREE(session, sftp->readdir_packet);
        sftp->readdir_packet = NULL;

        sftp->readdir_state = libssh2_NB_state_sent;
    }

    retcode = sftp_packet_requirev(sftp, 2, read_responses,
                                   sftp->readdir_request_id, &data,
                                   &data_len, 9);
    if(retcode == LIBSSH2_ERROR_EAGAIN)
        return retcode;
    else if(retcode == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "Status message too short");
    }
    else if(retcode) {
        sftp->readdir_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)retcode,
                              "Timeout waiting for status message");
    }

    if(data[0] == SSH_FXP_STATUS) {
        unsigned int rerrno;
        rerrno = _libssh2_ntohu32(data + 5);
        LIBSSH2_FREE(session, data);
        if(rerrno == LIBSSH2_FX_EOF) {
            sftp->readdir_state = libssh2_NB_state_idle;
            return 0;
        }
        else {
            sftp->last_errno = rerrno;
            sftp->readdir_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                  "SFTP Protocol Error");
        }
    }

    sftp->readdir_state = libssh2_NB_state_idle;

    num_names = _libssh2_ntohu32(data + 5);
    _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "%lu entries returned",
                   num_names));
    if(!num_names) {
        LIBSSH2_FREE(session, data);
        return 0;
    }

    handle->u.dir.names_left = num_names;
    handle->u.dir.names_packet = data;
    handle->u.dir.next_name = (char *) data + 9;
    handle->u.dir.names_packet_len = data_len - 9;

    /* use the name popping mechanism from the start of the function */
    return sftp_readdir(handle, buffer, buffer_maxlen, longentry,
                        longentry_maxlen, attrs);
}